

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

int __thiscall
MODEL3D::three_dim_model::generate_non_fill_layer
          (three_dim_model *this,int *layer_number,int *mask_type)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar1;
  pointer pvVar2;
  pointer pIVar3;
  _List_node_base *p_Var4;
  uint uVar5;
  double dVar6;
  uint uVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  long *plVar10;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *has_holes;
  ulong uVar13;
  uint uVar14;
  pointer pvVar15;
  Path *input_path;
  iterator pos_it;
  double dVar16;
  pointer pvVar17;
  three_dim_model *this_01;
  Paths solution_paths;
  string __str;
  Paths secondary_paths;
  Paths primary_paths;
  Paths positives;
  ClipperOffset co;
  Clipper my_mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  Paths local_318;
  three_dim_model *local_2f8;
  long *local_2f0 [2];
  long local_2e0 [2];
  uint *local_2d0;
  Paths local_2c8;
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  local_2a8;
  Paths local_288;
  int *local_270;
  double local_268;
  pointer local_260;
  double local_258;
  ClipperOffset local_248;
  undefined1 local_148 [136];
  ClipperBase local_c0;
  
  local_270 = mask_type;
  pmVar8 = std::
           map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
           ::operator[](&this->etch_contour_map,layer_number);
  local_258 = round((pmVar8->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1].x * 1.4);
  local_268 = round(local_258 / -10.0);
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._0_4_ = *layer_number;
  pmVar9 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,(key_type_conflict *)local_148);
  pvVar2 = (pmVar9->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148._0_4_ = *layer_number;
  local_2d0 = (uint *)layer_number;
  pmVar9 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,(key_type_conflict *)local_148);
  pvVar15 = (pmVar9->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_2f8 = this;
  local_260 = pvVar2;
  if (pvVar15 != pvVar2) {
    do {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_148,
                 pvVar15);
      local_248.MiterLimit = 0.0;
      local_248.ArcTolerance = 0.0;
      local_248.m_destPolys.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ClipperLib::SimplifyPolygon
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_148,
                 (Paths *)&local_248,pftNonZero);
      dVar6 = local_248.ArcTolerance;
      for (dVar16 = local_248.MiterLimit; dVar6 != dVar16; dVar16 = (double)((long)dVar16 + 0x18)) {
        std::
        vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>>
                  ((vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    *)&local_288,
                   local_288.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_248.MiterLimit);
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)&local_248);
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
      }
      pvVar15 = pvVar15 + 1;
    } while (pvVar15 != local_260);
  }
  this_01 = local_2f8;
  ClipperLib::Clipper::Clipper((Clipper *)local_148,0);
  local_318.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ClipperLib::ClipperOffset::ClipperOffset(&local_248,2.0,0.25);
  ClipperLib::ClipperOffset::Clear(&local_248);
  ClipperLib::ClipperOffset::AddPaths(&local_248,&local_288,jtMiter,etClosedPolygon);
  pvVar15 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = local_318.
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pIVar3 = (pvVar17->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pIVar3 != (pointer)0x0) {
        operator_delete(pIVar3,(long)(pvVar17->
                                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pIVar3);
      }
      pvVar17 = pvVar17 + 1;
    } while (pvVar17 != pvVar15);
    local_318.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    this_01 = local_2f8;
  }
  ClipperLib::ClipperOffset::Execute(&local_248,&local_318,local_268);
  ClipperLib::ClipperOffset::Clear(&local_248);
  ClipperLib::ClipperOffset::AddPaths(&local_248,&local_318,jtMiter,etClosedPolygon);
  pvVar15 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = local_318.
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pIVar3 = (pvVar17->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pIVar3 != (pointer)0x0) {
        operator_delete(pIVar3,(long)(pvVar17->
                                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pIVar3);
      }
      pvVar17 = pvVar17 + 1;
    } while (pvVar17 != pvVar15);
    local_318.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    this_01 = local_2f8;
  }
  ClipperLib::ClipperOffset::Execute(&local_248,&local_318,local_258);
  ClipperLib::ClipperOffset::Clear(&local_248);
  ClipperLib::ClipperOffset::AddPaths
            (&local_248,&local_318,jtMiter - this_01->round_concave_corners,etClosedPolygon);
  pvVar15 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = local_318.
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = local_318.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_318.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pIVar3 = (pvVar17->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pIVar3 != (pointer)0x0) {
        operator_delete(pIVar3,(long)(pvVar17->
                                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pIVar3);
      }
      pvVar17 = pvVar17 + 1;
    } while (pvVar17 != pvVar15);
    local_318.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    this_01 = local_2f8;
  }
  ClipperLib::ClipperOffset::Execute(&local_248,&local_318,-local_258);
  local_2a8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (Path *)0x0;
  local_2a8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Path *)0x0;
  local_2a8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (Path *)0x0;
  local_2c8.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Path *)0x0;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::operator=(&local_2a8,&local_318);
  filter_paths(this_01,&local_2a8,&local_2c8);
  pvVar2 = local_2a8.
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar15 = local_2a8.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar17 = local_2c8.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      input_path = local_2c8.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, pvVar15 != pvVar2;
      pvVar15 = pvVar15 + 1) {
    tidy_path(this_01,pvVar15);
  }
  for (; input_path != pvVar17; input_path = input_path + 1) {
    tidy_path(this_01,input_path);
  }
  repair_circles(this_01,&local_2a8);
  repair_circles(this_01,&local_2c8);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  this_00 = &this_01->py_script;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_338
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  uVar1 = *local_2d0;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar14 = 1;
  if (9 < uVar5) {
    uVar13 = (ulong)uVar5;
    uVar7 = 4;
    do {
      uVar14 = uVar7;
      uVar11 = (uint)uVar13;
      if (uVar11 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0014da4b;
      }
      if (uVar11 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0014da4b;
      }
      if (uVar11 < 10000) goto LAB_0014da4b;
      uVar13 = uVar13 / 10000;
      uVar7 = uVar14 + 4;
    } while (99999 < uVar11);
    uVar14 = uVar14 + 1;
  }
LAB_0014da4b:
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct((ulong)local_2f0,(char)uVar14 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_2f0[0]),uVar14,uVar5);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x179171);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar12) {
    local_338.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_338.field_2._8_8_ = plVar10[3];
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  }
  else {
    local_338.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_338._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_338._M_string_length = plVar10[1];
  *plVar10 = (long)paVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_338
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  uVar1 = *local_2d0;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar14 = 1;
  if (9 < uVar5) {
    uVar13 = (ulong)uVar5;
    uVar7 = 4;
    do {
      uVar14 = uVar7;
      uVar11 = (uint)uVar13;
      if (uVar11 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0014db7a;
      }
      if (uVar11 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0014db7a;
      }
      if (uVar11 < 10000) goto LAB_0014db7a;
      uVar13 = uVar13 / 10000;
      uVar7 = uVar14 + 4;
    } while (99999 < uVar11);
    uVar14 = uVar14 + 1;
  }
LAB_0014db7a:
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct((ulong)local_2f0,(char)uVar14 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_2f0[0]),uVar14,uVar5);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x17917e);
  paVar12 = &local_338.field_2;
  has_holes = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == has_holes) {
    local_338.field_2._M_allocated_capacity = has_holes->_M_allocated_capacity;
    local_338.field_2._8_8_ = plVar10[3];
    local_338._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_338.field_2._M_allocated_capacity = has_holes->_M_allocated_capacity;
    local_338._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_338._M_string_length = plVar10[1];
  *plVar10 = (long)has_holes;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_338
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar12) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  local_338._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,"    print(f\'Generating Layer {current_layer}.\')","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_338
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar12) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  generate_freecad_solid
            (this_01,&local_2a8,&local_2c8,(bool *)has_holes->_M_local_buf,(int *)local_2d0,
             local_270);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_2a8);
  ClipperLib::ClipperOffset::~ClipperOffset(&local_248);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_318);
  local_148._0_8_ = &PTR_ExecuteInternal_00197c50;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00197c98;
  while ((_List_node_base *)local_148._88_8_ != (_List_node_base *)(local_148 + 0x58)) {
    p_Var4 = ((_List_node_base *)local_148._88_8_)->_M_next;
    operator_delete((void *)local_148._88_8_,0x18);
    local_148._88_8_ = p_Var4;
  }
  if ((pointer)local_148._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._56_8_,local_148._72_8_ - local_148._56_8_);
  }
  if ((pointer)local_148._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._32_8_,local_148._48_8_ - local_148._32_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ - local_148._8_8_);
  }
  ClipperLib::ClipperBase::~ClipperBase(&local_c0);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_288);
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::generate_non_fill_layer(const int &layer_number, const int &mask_type)
{
    double cont_wid = std::prev(etch_contour_map[layer_number].end(),1)->x;
    double countour_width = std::round(cont_wid*1.4);//40% tolerance to avoid bunching
    double foot_adjustment = std::round(-(countour_width/10));
    ClipperLib::Paths positives;
    auto poly_end = clipper_polygons_map[layer_number].end();
    // For each polygon on this layer.
    for (   auto poly_it = clipper_polygons_map[layer_number].begin();
            poly_it != poly_end; poly_it++)
    {
        ClipperLib::Path my_path = *poly_it;
        ClipperLib::Paths positive;
        ClipperLib::SimplifyPolygon(my_path, positive, ClipperLib::pftNonZero);
        if(positive.size()>0)
        {
            auto pos_end = positive.end();
            for (auto pos_it = positive.begin(); pos_it != pos_end; pos_it++)
            {
                positives.insert(positives.end(),positive.begin(),positive.end());
            }
        }
    }
    ClipperLib::Clipper my_mask;
    ClipperLib::Paths solution_paths;
    ClipperLib::ClipperOffset co;
    // shift by foot adjustment
    co.Clear();
    co.AddPaths(positives, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, foot_adjustment);
    // grow by contour width
    co.Clear();
    co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, countour_width);
    // reduce by contour width (creates correct contour profile)
    co.Clear();
    if(round_concave_corners==true)
        co.AddPaths(solution_paths, ClipperLib::jtRound, ClipperLib::etClosedPolygon);
    else
        co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    // co.ArcTolerance = 0.25;
    co.Execute(solution_paths, -countour_width);
    // filter into primary and secondary shapes
    ClipperLib::Paths primary_paths, secondary_paths;
    primary_paths = solution_paths;
    bool has_holes = filter_paths(primary_paths, secondary_paths);
    tidy_paths(primary_paths);
    tidy_paths(secondary_paths);
    repair_circles(primary_paths);
    repair_circles(secondary_paths);
    py_script.push_back("");
    py_script.push_back("    # Layer " + std::to_string(layer_number) );
    py_script.push_back("    current_layer =  " + std::to_string(layer_number) );
    py_script.push_back("    print(f'Generating Layer {current_layer}.')");
    generate_freecad_solid(primary_paths, secondary_paths, has_holes, layer_number, mask_type);
    // if (primary_paths.size()>0)
    //     clipper_paths_to_gds(primary_paths, "Primary_paths", layer_number);
    // if (secondary_paths.size()>0)
    //     clipper_paths_to_gds(secondary_paths, "Secondary_paths", layer_number);
    return EXIT_SUCCESS;
}